

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datahashtable.h
# Opt level: O3

void __thiscall
soplex::DataHashTable<soplex::NameSet::Name,_soplex::DataKey>::add
          (DataHashTable<soplex::NameSet::Name,_soplex::DataKey> *this,Name *h,DataKey *info)

{
  long lVar1;
  int iVar2;
  long lVar3;
  pointer pEVar4;
  int iVar5;
  
  if ((double)((int)((ulong)((long)(this->m_elem).data.
                                   super__Vector_base<soplex::DataHashTable<soplex::NameSet::Name,_soplex::DataKey>::Element<soplex::NameSet::Name,_soplex::DataKey>,_std::allocator<soplex::DataHashTable<soplex::NameSet::Name,_soplex::DataKey>::Element<soplex::NameSet::Name,_soplex::DataKey>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(this->m_elem).data.
                                  super__Vector_base<soplex::DataHashTable<soplex::NameSet::Name,_soplex::DataKey>::Element<soplex::NameSet::Name,_soplex::DataKey>,_std::allocator<soplex::DataHashTable<soplex::NameSet::Name,_soplex::DataKey>::Element<soplex::NameSet::Name,_soplex::DataKey>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x55555555) *
      0.7 <= (double)this->m_used) {
    reMax(this,(int)((double)this->m_used * this->m_memfactor) + 1,0);
  }
  iVar2 = (*this->m_hashfun)(h);
  pEVar4 = (this->m_elem).data.
           super__Vector_base<soplex::DataHashTable<soplex::NameSet::Name,_soplex::DataKey>::Element<soplex::NameSet::Name,_soplex::DataKey>,_std::allocator<soplex::DataHashTable<soplex::NameSet::Name,_soplex::DataKey>::Element<soplex::NameSet::Name,_soplex::DataKey>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  iVar5 = (int)((ulong)((long)(this->m_elem).data.
                              super__Vector_base<soplex::DataHashTable<soplex::NameSet::Name,_soplex::DataKey>::Element<soplex::NameSet::Name,_soplex::DataKey>,_std::allocator<soplex::DataHashTable<soplex::NameSet::Name,_soplex::DataKey>::Element<soplex::NameSet::Name,_soplex::DataKey>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pEVar4) >> 3) *
          -0x55555555;
  lVar1 = (long)iVar2 % (long)iVar5;
  lVar3 = (long)(int)lVar1;
  if (*(states *)((long)(pEVar4 + lVar3) + 0x10) == USED) {
    do {
      lVar1 = (long)((int)lVar1 + this->m_hashsize) % (long)iVar5;
      lVar3 = (long)(int)lVar1;
    } while (*(states *)((long)(pEVar4 + lVar3) + 0x10) == USED);
  }
  *(states *)((long)(pEVar4 + lVar3) + 0x10) = USED;
  *(DataKey *)((long)(pEVar4 + lVar3) + 8) = *info;
  pEVar4 = (this->m_elem).data.
           super__Vector_base<soplex::DataHashTable<soplex::NameSet::Name,_soplex::DataKey>::Element<soplex::NameSet::Name,_soplex::DataKey>,_std::allocator<soplex::DataHashTable<soplex::NameSet::Name,_soplex::DataKey>::Element<soplex::NameSet::Name,_soplex::DataKey>_>_>
           ._M_impl.super__Vector_impl_data._M_start + lVar3;
  if (pEVar4 != (pointer)h) {
    (pEVar4->item).name = h->name;
  }
  this->m_used = this->m_used + 1;
  return;
}

Assistant:

void add(const HashItem& h, const Info& info)
   {
      assert(!has(h));

      if(m_used >= m_elem.size() * SOPLEX_HASHTABLE_FILLFACTOR)
         reMax(int(m_memfactor * m_used) + 1);

      assert(m_used < m_elem.size());

      decltype(m_elem.size()) i;

      for(i = (*m_hashfun)(&h) % m_elem.size();
            m_elem[i].stat == Elem::USED;
            i = (i + m_hashsize) % m_elem.size())
         ;

      assert(m_elem[i].stat != Elem::USED);

      m_elem[i].stat = Elem::USED;
      m_elem[i].info = info;
      m_elem[i].item = h;

      m_used++;

      assert(has(h));
   }